

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccs_test.cpp
# Opt level: O2

void __thiscall CcsTest_Coercion_Test::TestBody(CcsTest_Coercion_Test *this)

{
  bool bVar1;
  pointer *__ptr;
  char *pcVar2;
  string local_118;
  allocator local_f6;
  allocator local_f5;
  allocator local_f4;
  allocator local_f3;
  allocator local_f2;
  allocator local_f1;
  AssertHelper local_f0 [4];
  AssertionResult gtest_ar;
  CcsDomain ccs;
  CcsContext ctx;
  string local_88 [32];
  string local_68;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  undefined1 local_28 [32];
  
  ::ccs::CcsDomain::CcsDomain(&ccs,false);
  ::ccs::CcsDomain::ruleBuilder((CcsDomain *)local_48);
  std::__cxx11::string::string((string *)&local_118,"int",&local_f1);
  std::__cxx11::string::string((string *)&ctx,"123",&local_f2);
  ::ccs::RuleBuilder::set((RuleBuilder *)(local_48 + 0x10),(string *)local_48,&local_118);
  std::__cxx11::string::string((string *)&gtest_ar,"double",&local_f3);
  std::__cxx11::string::string((string *)local_f0,"123.0",&local_f4);
  ::ccs::RuleBuilder::set((RuleBuilder *)local_28,(string *)(local_48 + 0x10),(string *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_68,"bool",&local_f5);
  std::__cxx11::string::string(local_88,"true",&local_f6);
  ::ccs::RuleBuilder::set((RuleBuilder *)(local_28 + 0x10),(string *)local_28,&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 0x18));
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string((string *)&local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_28 + 8));
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  std::__cxx11::string::~string((string *)&ctx);
  std::__cxx11::string::~string((string *)&local_118);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_48 + 8));
  ::ccs::CcsDomain::build((CcsDomain *)&ctx);
  local_f0[0].data_._0_4_ = 0x7b;
  std::__cxx11::string::string((string *)&local_118,"int",(allocator *)local_88);
  local_68._M_dataplus._M_p._0_4_ = ::ccs::CcsContext::getInt(&ctx,&local_118);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"123","ctx.getInt(\"int\")",(int *)local_f0,(int *)&local_68);
  std::__cxx11::string::~string((string *)&local_118);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdc,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_f0[0].data_ = (AssertHelperData *)0x405ec00000000000;
  std::__cxx11::string::string((string *)&local_118,"int",(allocator *)local_88);
  local_68._M_dataplus._M_p = (pointer)::ccs::CcsContext::getDouble(&ctx,&local_118);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"123.0","ctx.getDouble(\"int\")",(double *)local_f0,
             (double *)&local_68);
  std::__cxx11::string::~string((string *)&local_118);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdd,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_f0[0].data_ = (AssertHelperData *)0x405ec00000000000;
  std::__cxx11::string::string((string *)&local_118,"double",(allocator *)local_88);
  local_68._M_dataplus._M_p = (pointer)::ccs::CcsContext::getDouble(&ctx,&local_118);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&gtest_ar,"123.0","ctx.getDouble(\"double\")",(double *)local_f0,
             (double *)&local_68);
  std::__cxx11::string::~string((string *)&local_118);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xde,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  local_f0[0].data_._0_1_ = 1;
  std::__cxx11::string::string((string *)&local_118,"bool",(allocator *)local_88);
  bVar1 = ::ccs::CcsContext::getBool(&ctx,&local_118);
  local_68._M_dataplus._M_p._0_1_ = bVar1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"true","ctx.getBool(\"bool\")",(bool *)local_f0,(bool *)&local_68
            );
  std::__cxx11::string::~string((string *)&local_118);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_118);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/hellige[P]ccs-cpp/test/ccs_test.cpp"
               ,0xdf,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,(Message *)&local_118);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    if ((long *)local_118._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_118._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ctx.searchState.super___shared_ptr<ccs::SearchState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::ccs::CcsDomain::~CcsDomain(&ccs);
  return;
}

Assistant:

TEST(CcsTest, Coercion) {
  CcsDomain ccs;
  ccs.ruleBuilder()
      .set("int", "123")
      .set("double", "123.0")
      .set("bool", "true");
  CcsContext ctx = ccs.build();
  EXPECT_EQ(123, ctx.getInt("int"));
  EXPECT_EQ(123.0, ctx.getDouble("int"));
  EXPECT_EQ(123.0, ctx.getDouble("double"));
  EXPECT_EQ(true, ctx.getBool("bool"));
}